

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

int Aig_ObjRecognizeExor(Aig_Obj_t *pObj,Aig_Obj_t **ppFan0,Aig_Obj_t **ppFan1)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *p1;
  Aig_Obj_t *p0;
  Aig_Obj_t **ppFan1_local;
  Aig_Obj_t **ppFan0_local;
  Aig_Obj_t *pObj_local;
  
  iVar1 = Aig_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                  ,0x15a,"int Aig_ObjRecognizeExor(Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)");
  }
  iVar1 = Aig_ObjIsNode(pObj);
  if (iVar1 == 0) {
    pObj_local._4_4_ = 0;
  }
  else {
    iVar1 = Aig_ObjIsExor(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsAnd(pObj);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                      ,0x163,"int Aig_ObjRecognizeExor(Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)");
      }
      pAVar3 = Aig_ObjChild0(pObj);
      pAVar4 = Aig_ObjChild1(pObj);
      iVar1 = Aig_IsComplement(pAVar3);
      if ((iVar1 != 0) && (iVar1 = Aig_IsComplement(pAVar4), iVar1 != 0)) {
        pAVar3 = Aig_Regular(pAVar3);
        pAVar4 = Aig_Regular(pAVar4);
        iVar1 = Aig_ObjIsAnd(pAVar3);
        if ((iVar1 != 0) && (iVar1 = Aig_ObjIsAnd(pAVar4), iVar1 != 0)) {
          pAVar5 = Aig_ObjFanin0(pAVar3);
          pAVar6 = Aig_ObjFanin0(pAVar4);
          if (pAVar5 == pAVar6) {
            pAVar5 = Aig_ObjFanin1(pAVar3);
            pAVar6 = Aig_ObjFanin1(pAVar4);
            if (pAVar5 == pAVar6) {
              iVar1 = Aig_ObjFaninC0(pAVar3);
              iVar2 = Aig_ObjFaninC0(pAVar4);
              if (iVar1 != iVar2) {
                iVar1 = Aig_ObjFaninC1(pAVar3);
                iVar2 = Aig_ObjFaninC1(pAVar4);
                if (iVar1 != iVar2) {
                  pAVar4 = Aig_ObjChild0(pAVar3);
                  *ppFan0 = pAVar4;
                  pAVar3 = Aig_ObjChild1(pAVar3);
                  *ppFan1 = pAVar3;
                  return 1;
                }
              }
              return 0;
            }
          }
          return 0;
        }
        return 0;
      }
      pObj_local._4_4_ = 0;
    }
    else {
      pAVar3 = Aig_ObjChild0(pObj);
      *ppFan0 = pAVar3;
      pAVar3 = Aig_ObjChild1(pObj);
      *ppFan1 = pAVar3;
      pObj_local._4_4_ = 1;
    }
  }
  return pObj_local._4_4_;
}

Assistant:

int Aig_ObjRecognizeExor( Aig_Obj_t * pObj, Aig_Obj_t ** ppFan0, Aig_Obj_t ** ppFan1 )
{
    Aig_Obj_t * p0, * p1;
    assert( !Aig_IsComplement(pObj) );
    if ( !Aig_ObjIsNode(pObj) )
        return 0;
    if ( Aig_ObjIsExor(pObj) )
    {
        *ppFan0 = Aig_ObjChild0(pObj);
        *ppFan1 = Aig_ObjChild1(pObj);
        return 1;
    }
    assert( Aig_ObjIsAnd(pObj) );
    p0 = Aig_ObjChild0(pObj);
    p1 = Aig_ObjChild1(pObj);
    if ( !Aig_IsComplement(p0) || !Aig_IsComplement(p1) )
        return 0;
    p0 = Aig_Regular(p0);
    p1 = Aig_Regular(p1);
    if ( !Aig_ObjIsAnd(p0) || !Aig_ObjIsAnd(p1) )
        return 0;
    if ( Aig_ObjFanin0(p0) != Aig_ObjFanin0(p1) || Aig_ObjFanin1(p0) != Aig_ObjFanin1(p1) )
        return 0;
    if ( Aig_ObjFaninC0(p0) == Aig_ObjFaninC0(p1) || Aig_ObjFaninC1(p0) == Aig_ObjFaninC1(p1) )
        return 0;
    *ppFan0 = Aig_ObjChild0(p0);
    *ppFan1 = Aig_ObjChild1(p0);
    return 1;
}